

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void adjustlocalvars(LexState *ls,int nvars)

{
  byte bVar1;
  int iVar2;
  FuncState *fs;
  Vardesc *pVVar3;
  TString *v;
  Proto *o;
  int iVar4;
  long lVar5;
  LocVar *pLVar6;
  short sVar7;
  long lVar8;
  LocVar *pLVar9;
  int iVar10;
  
  fs = ls->fs;
  iVar4 = luaY_nvarstack(fs);
  iVar10 = 0;
  if (nvars < 1) {
    nvars = 0;
  }
  for (; iVar10 != nvars; iVar10 = iVar10 + 1) {
    bVar1 = fs->nactvar;
    fs->nactvar = bVar1 + 1;
    pVVar3 = (fs->ls->dyd->actvar).arr;
    lVar8 = (long)fs->firstlocal + (ulong)bVar1;
    lVar5 = lVar8 * 0x18;
    *(char *)((long)pVVar3 + lVar5 + 10) = (char)iVar4;
    v = *(TString **)((long)pVVar3 + lVar5 + 0x10);
    o = fs->f;
    lVar5 = (long)o->sizelocvars;
    pLVar6 = (LocVar *)
             luaM_growaux_(ls->L,o->locvars,(int)fs->ndebugvars,&o->sizelocvars,0x10,0x7fff,
                           "local variables");
    o->locvars = pLVar6;
    iVar2 = o->sizelocvars;
    pLVar9 = pLVar6 + lVar5;
    for (; lVar5 < iVar2; lVar5 = lVar5 + 1) {
      pLVar9->varname = (TString *)0x0;
      pLVar9 = pLVar9 + 1;
    }
    sVar7 = fs->ndebugvars;
    pLVar6[sVar7].varname = v;
    pLVar6[sVar7].startpc = fs->pc;
    if (((o->marked & 0x20) != 0) && ((v->marked & 0x18) != 0)) {
      luaC_barrier_(ls->L,(GCObject *)o,(GCObject *)v);
      sVar7 = fs->ndebugvars;
    }
    iVar4 = iVar4 + 1;
    fs->ndebugvars = sVar7 + 1;
    (&pVVar3->vd)[lVar8].pidx = sVar7;
  }
  return;
}

Assistant:

static void adjustlocalvars (LexState *ls, int nvars) {
  FuncState *fs = ls->fs;
  int reglevel = luaY_nvarstack(fs);
  int i;
  for (i = 0; i < nvars; i++) {
    int vidx = fs->nactvar++;
    Vardesc *var = getlocalvardesc(fs, vidx);
    var->vd.ridx = reglevel++;
    var->vd.pidx = registerlocalvar(ls, fs, var->vd.name);
  }
}